

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::DataParameter::SharedCtor(DataParameter *this)

{
  string *psVar1;
  DataParameter *this_local;
  
  this->_cached_size_ = 0;
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->source_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->mean_file_,psVar1);
  memset(&this->batch_size_,0,0x14);
  this->scale_ = 1.0;
  this->prefetch_ = 4;
  return;
}

Assistant:

void DataParameter::SharedCtor() {
  _cached_size_ = 0;
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&batch_size_, 0, reinterpret_cast<char*>(&backend_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(backend_));
  scale_ = 1;
  prefetch_ = 4u;
}